

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.h
# Opt level: O1

bool __thiscall
rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseRange<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
          (GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          DecodedStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_rapidjson::UTF8<char>_>
          *ds,SizeType *range)

{
  uint *puVar1;
  uint uVar2;
  bool bVar3;
  undefined7 extraout_var;
  Range *pRVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  bool bVar8;
  uint codepoint;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  DecodedStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_rapidjson::UTF8<char>_>
  *local_48;
  Stack<rapidjson::CrtAllocator> *local_40;
  SizeType *local_38;
  
  uVar7 = ds->codepoint_;
  bVar8 = uVar7 == 0;
  if (!bVar8) {
    puVar1 = &ds->codepoint_;
    local_40 = (Stack<rapidjson::CrtAllocator> *)(this + 0x40);
    iVar5 = 0;
    uVar6 = 0xffffffff;
    local_50 = (uint)CONCAT71((int7)((ulong)local_40 >> 8),1);
    local_54 = 0xffffffff;
    local_4c = 0;
    local_48 = ds;
    local_38 = range;
    do {
      bVar3 = UTF8<char>::Decode<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
                        (local_48->ss_,puVar1);
      uVar2 = local_54;
      if (!bVar3) {
        *puVar1 = 0;
      }
      if (bVar8) {
        return false;
      }
      local_58 = uVar7;
      if ((local_50 & 1) == 0) {
LAB_0013fd71:
        if (uVar7 == 0x5c) {
          if (*puVar1 == 0x62) {
            bVar8 = UTF8<char>::Decode<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
                              (local_48->ss_,puVar1);
            if (!bVar8) {
              *puVar1 = 0;
            }
            local_58 = 8;
          }
          else {
            bVar8 = CharacterEscape<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
                              (this,local_48,&local_58);
            if (!bVar8) {
              return false;
            }
          }
        }
        else if (uVar7 == 0x5d) {
          if (local_54 == 0xffffffff) {
            return false;
          }
          if (iVar5 == 2) {
            pRVar4 = Stack<rapidjson::CrtAllocator>::
                     Push<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::Range>
                               (local_40,1);
            pRVar4->start = 0x2d;
            pRVar4->end = 0x2d;
            pRVar4->next = 0xffffffff;
            iVar5 = *(int *)(this + 0x78);
            uVar7 = iVar5 + 1;
            *(uint *)(this + 0x78) = uVar7;
            if (uVar6 == 0xffffffff) {
              __assert_fail("current != kRegexInvalidRange",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/regex.h"
                            ,0x1f8,
                            "bool rapidjson::internal::GenericRegex<rapidjson::UTF8<>>::ParseRange(DecodedStream<InputStream, Encoding> &, SizeType *) [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::CrtAllocator, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>]"
                           );
            }
            if (uVar7 <= uVar6) goto LAB_0013ff1c;
            *(int *)(*(long *)(this + 0x50) + 8 + (ulong)uVar6 * 0xc) = iVar5;
          }
          if ((local_4c & 1) == 0) {
LAB_0013ff12:
            *local_38 = uVar2;
            return true;
          }
          if (uVar2 < *(uint *)(this + 0x78)) {
            puVar1 = (uint *)(*(long *)(this + 0x50) + (ulong)uVar2 * 0xc);
            *puVar1 = *puVar1 | 0x80000000;
            goto LAB_0013ff12;
          }
          goto LAB_0013ff1c;
        }
        uVar7 = local_58;
        if (iVar5 == 0) {
LAB_0013fde3:
          pRVar4 = Stack<rapidjson::CrtAllocator>::
                   Push<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::Range>
                             (local_40,1);
          pRVar4->end = uVar7;
          pRVar4->start = uVar7;
          pRVar4->next = 0xffffffff;
          uVar7 = *(uint *)(this + 0x78);
          *(uint *)(this + 0x78) = uVar7 + 1;
          if (uVar6 != 0xffffffff) {
            if (uVar7 + 1 <= uVar6) {
LAB_0013ff1c:
              __assert_fail("index < rangeCount_",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/regex.h"
                            ,0xb4,
                            "Range &rapidjson::internal::GenericRegex<rapidjson::UTF8<>>::GetRange(SizeType) [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::CrtAllocator]"
                           );
            }
            *(uint *)(*(long *)(this + 0x50) + 8 + (ulong)uVar6 * 0xc) = uVar7;
          }
          if (local_54 == 0xffffffff) {
            local_54 = uVar7;
          }
          iVar5 = 1;
          uVar6 = uVar7;
        }
        else if (iVar5 == 2) {
          if (*(uint *)(this + 0x78) <= uVar6) goto LAB_0013ff1c;
          *(uint *)(*(long *)(this + 0x50) + 4 + (ulong)uVar6 * 0xc) = local_58;
          iVar5 = 0;
        }
        else {
          if (iVar5 != 1) {
            __assert_fail("step == 2",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/regex.h"
                          ,0x221,
                          "bool rapidjson::internal::GenericRegex<rapidjson::UTF8<>>::ParseRange(DecodedStream<InputStream, Encoding> &, SizeType *) [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::CrtAllocator, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>]"
                         );
          }
          iVar5 = 2;
          if (local_58 != 0x2d) goto LAB_0013fde3;
        }
        uVar7 = *puVar1;
      }
      else {
        if (uVar7 != 0x5e) {
          local_50 = 0;
          goto LAB_0013fd71;
        }
        local_50 = 0;
        local_4c = (uint)CONCAT71(extraout_var,1);
        uVar7 = *puVar1;
      }
      bVar8 = uVar7 == 0;
    } while (!bVar8);
  }
  return false;
}

Assistant:

unsigned Take() {
        unsigned c = codepoint_;
        if (c) // No further decoding when '\0'
            Decode();
        return c;
    }